

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O1

int32_t __thiscall icu_63::Package::findItem(Package *this,char *name,int32_t length)

{
  uint uVar1;
  char *__s2;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Item *pIVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar8 = this->itemCount;
  if ((int)uVar8 < 1) {
    return -1;
  }
  pIVar5 = this->items;
  uVar6 = 0;
  while( true ) {
    uVar1 = uVar8 + uVar6;
    uVar3 = uVar1 >> 1;
    __s2 = pIVar5[uVar3].name;
    if (length < 0) {
      iVar4 = strcmp(name,__s2);
    }
    else {
      iVar4 = strncmp(name,__s2,(ulong)(uint)length);
    }
    if (iVar4 == 0) break;
    if (-1 < iVar4) {
      uVar6 = uVar3 + 1;
      uVar3 = uVar8;
    }
    uVar8 = uVar3;
    if ((int)uVar8 <= (int)uVar6) {
      return ~uVar6;
    }
  }
  if (length < 0) {
    return uVar3;
  }
  if (1 < uVar1) {
    pIVar5 = this->items + (uVar1 >> 1);
    uVar7 = (ulong)(uVar1 >> 1);
    do {
      pIVar5 = pIVar5 + -1;
      iVar4 = strncmp(name,pIVar5->name,(ulong)(uint)length);
      if (iVar4 != 0) {
        return (int32_t)uVar7;
      }
      bVar2 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar2);
    return 0;
  }
  return uVar3;
}

Assistant:

int32_t
Package::findItem(const char *name, int32_t length) const {
    int32_t i, start, limit;
    int result;

    /* do a binary search for the string */
    start=0;
    limit=itemCount;
    while(start<limit) {
        i=(start+limit)/2;
        if(length>=0) {
            result=strncmp(name, items[i].name, length);
        } else {
            result=strcmp(name, items[i].name);
        }

        if(result==0) {
            /* found */
            if(length>=0) {
                /*
                 * if we compared just prefixes, then we may need to back up
                 * to the first item with this prefix
                 */
                while(i>0 && 0==strncmp(name, items[i-1].name, length)) {
                    --i;
                }
            }
            return i;
        } else if(result<0) {
            limit=i;
        } else /* result>0 */ {
            start=i+1;
        }
    }

    return ~start; /* not found, return binary-not of the insertion point */
}